

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

ElabSystemTaskSymbol * __thiscall
slang::ast::ElabSystemTaskSymbol::fromSyntax
          (ElabSystemTaskSymbol *this,Compilation *compilation,ElabSystemTaskSyntax *syntax)

{
  ElabSystemTaskSymbol *pEVar1;
  Token token;
  ElabSystemTaskKind taskKind;
  ElabSystemTaskKind local_2c;
  SourceLocation local_28;
  
  token.info = (Info *)syntax;
  token._0_8_ = (compilation->options).topModules.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                .arrays.groups_size_index;
  local_2c = SemanticFacts::getElabSystemTaskKind
                       (*(SemanticFacts **)
                         &(compilation->options).defaultTimeScale.
                          super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                          super__Optional_payload_base<slang::TimeScale>._M_engaged,token);
  local_28 = parsing::Token::location
                       ((Token *)&(compilation->options).defaultTimeScale.
                                  super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                                  super__Optional_payload_base<slang::TimeScale>._M_engaged);
  pEVar1 = BumpAllocator::
           emplace<slang::ast::ElabSystemTaskSymbol,slang::ast::ElabSystemTaskKind&,slang::SourceLocation>
                     ((BumpAllocator *)this,&local_2c,&local_28);
  (pEVar1->super_Symbol).originatingSyntax = (SyntaxNode *)compilation;
  return pEVar1;
}

Assistant:

ElabSystemTaskSymbol& ElabSystemTaskSymbol::fromSyntax(Compilation& compilation,
                                                       const ElabSystemTaskSyntax& syntax) {
    // Just create the symbol now. The diagnostic will be issued later
    // when someone visits the symbol and asks for it.
    auto taskKind = SemanticFacts::getElabSystemTaskKind(syntax.name);
    auto result = compilation.emplace<ElabSystemTaskSymbol>(taskKind, syntax.name.location());
    result->setSyntax(syntax);
    return *result;
}